

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O3

void __thiscall
astar::Map::Map(Map *this,
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *map)

{
  pointer pvVar1;
  int iVar2;
  
  (this->map).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->map).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->map).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::operator=(&this->map,map);
  pvVar1 = (this->map).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar2 = (int)((ulong)((long)(this->map).
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) >> 3) *
          -0x55555555;
  this->n = iVar2;
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  else {
    iVar2 = (int)((ulong)((long)*(pointer *)
                                 ((long)&(pvVar1->super__Vector_base<int,_std::allocator<int>_>).
                                         _M_impl + 8) -
                         *(long *)&(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl)
                 >> 2);
  }
  this->m = iVar2;
  return;
}

Assistant:

Map::Map(const std::vector<std::vector<int>>& map)
{
    this->map = map;
    n = this->map.size();
    m = (n > 0 ? this->map[0].size() : 0);
}